

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int io_tmpfile(lua_State *L)

{
  int iVar1;
  LStream *pLVar2;
  int *piVar3;
  FILE *pFVar4;
  
  pLVar2 = newfile(L);
  piVar3 = __errno_location();
  *piVar3 = 0;
  pFVar4 = tmpfile64();
  pLVar2->f = (FILE *)pFVar4;
  if (pFVar4 != (FILE *)0x0) {
    return 1;
  }
  iVar1 = luaL_fileresult(L,0,(char *)0x0);
  return iVar1;
}

Assistant:

static int io_tmpfile (lua_State *L) {
  LStream *p = newfile(L);
  errno = 0;
  p->f = tmpfile();
  return (p->f == NULL) ? luaL_fileresult(L, 0, NULL) : 1;
}